

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O0

bool __thiscall Gluco::Solver::simplify(Solver *this)

{
  int iVar1;
  CRef CVar2;
  Solver *this_local;
  
  iVar1 = decisionLevel(this);
  if (iVar1 != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                  ,0x3e9,"bool Gluco::Solver::simplify()");
  }
  if (((this->ok & 1U) != 0) && (CVar2 = propagate(this), CVar2 == 0xffffffff)) {
    iVar1 = nAssigns(this);
    if ((iVar1 != this->simpDB_assigns) && (this->simpDB_props < 1)) {
      removeSatisfied(this,&this->learnts);
      if ((this->remove_satisfied & 1U) != 0) {
        removeSatisfied(this,&this->clauses);
      }
      checkGarbage(this);
      rebuildOrderHeap(this);
      iVar1 = nAssigns(this);
      this->simpDB_assigns = iVar1;
      this->simpDB_props = this->clauses_literals + this->learnts_literals;
      return true;
    }
    return true;
  }
  this->ok = false;
  return false;
}

Assistant:

bool Solver::simplify()
{
    assert(decisionLevel() == 0);

    if (!ok || propagate() != CRef_Undef)
        return ok = false;

    if (nAssigns() == simpDB_assigns || (simpDB_props > 0))
        return true;

    // Remove satisfied clauses:
    removeSatisfied(learnts);
    if (remove_satisfied)        // Can be turned off.
        removeSatisfied(clauses);

    checkGarbage();

    rebuildOrderHeap();

    simpDB_assigns = nAssigns();
    simpDB_props   = clauses_literals + learnts_literals;   // (shouldn't depend on stats really, but it will do for now)

    return true;
}